

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.h
# Opt level: O1

bool __thiscall minihttp::HttpSocket::HasPendingTask(HttpSocket *this)

{
  _Map_pointer ppRVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((this->_remaining == 0) && ((this->_chunkedTransfer & 1U) == 0)) {
    ppRVar1 = (this->_requestQ).c.
              super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    bVar2 = ((long)(this->_requestQ).c.
                   super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur -
             (long)(this->_requestQ).c.
                   super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_first >> 3) * -0x7b425ed097b425ed +
            (((long)ppRVar1 -
              (long)(this->_requestQ).c.
                    super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl
                    .super__Deque_impl_data._M_start._M_node >> 3) + -1 +
            (ulong)(ppRVar1 == (_Map_pointer)0x0)) * 2 !=
            ((long)(this->_requestQ).c.
                   super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
                   super__Deque_impl_data._M_start._M_last -
             (long)(this->_requestQ).c.
                   super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur >> 3) * 0x7b425ed097b425ed;
  }
  return bVar2;
}

Assistant:

bool ExpectMoreData() const { return _remaining || _chunkedTransfer; }